

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O3

void cJSON_AddItemToObject(cJSON *object,char *string,cJSON *item)

{
  byte *pbVar1;
  size_t sVar2;
  char *string_00;
  
  if (item == (cJSON *)0x0) {
    return;
  }
  if (string != (char *)0x0) {
    sVar2 = strlen(string);
    string_00 = (char *)(*global_hooks.allocate)(sVar2 + 1);
    if (string_00 != (char *)0x0) {
      memcpy(string_00,string,sVar2 + 1);
      goto LAB_001031a4;
    }
  }
  string_00 = (char *)0x0;
LAB_001031a4:
  cJSON_AddItemToObjectCS(object,string_00,item);
  pbVar1 = (byte *)((long)&item->type + 1);
  *pbVar1 = *pbVar1 & 0xfd;
  return;
}

Assistant:

CJSON_PUBLIC(void) cJSON_AddItemToObject(cJSON *object, const char *string, cJSON *item)
{
    if (item == NULL)
    {
        return;
    }

    /* call cJSON_AddItemToObjectCS for code reuse */
    cJSON_AddItemToObjectCS(object, (char*)cJSON_strdup((const unsigned char*)string, &global_hooks), item);
    /* remove cJSON_StringIsConst flag */
    item->type &= ~cJSON_StringIsConst;
}